

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

interresult __thiscall
tetgenmesh::sscoutsegment
          (tetgenmesh *this,face *searchsh,point endpt,int insertsegflag,int reporterrorflag,
          int chkencflag)

{
  uint uVar1;
  uint uVar2;
  point pdVar3;
  point pdVar4;
  unsigned_long uVar5;
  point pdVar6;
  point pb_00;
  bool bVar7;
  double dVar8;
  double dVar9;
  face *local_120;
  double local_118;
  double tq;
  double tp;
  double Q [3];
  double local_e8;
  double P [3];
  point pp;
  face newseg;
  double len;
  double ori_ca;
  double ori_ab;
  anon_enum_32 nextmove;
  interresult dir;
  point pd;
  point pc;
  point pb;
  point pa;
  point startpt;
  face neighsh;
  face flipshs [2];
  int chkencflag_local;
  int reporterrorflag_local;
  int insertsegflag_local;
  point endpt_local;
  face *searchsh_local;
  tetgenmesh *this_local;
  
  local_120 = (face *)&neighsh.shver;
  flipshs[1]._12_4_ = chkencflag;
  do {
    face::face(local_120);
    local_120 = local_120 + 1;
  } while (local_120 != (face *)&flipshs[1].shver);
  face::face((face *)&startpt);
  pdVar3 = sorg(this,searchsh);
  bVar7 = false;
  if (2 < this->b->verbose) {
    uVar1 = pointmark(this,pdVar3);
    uVar2 = pointmark(this,endpt);
    printf("      Scout segment (%d, %d).\n",(ulong)uVar1,(ulong)uVar2);
  }
  newseg._8_8_ = distance(this,pdVar3,endpt);
  do {
    pdVar4 = sdest(this,searchsh);
    if (pdVar4 == endpt) {
      ori_ab._4_4_ = SHAREEDGE;
LAB_00143f64:
      if (ori_ab._4_4_ == SHAREEDGE) {
        if (insertsegflag != 0) {
          face::face((face *)&pp);
          makeshellface(this,this->subsegs,(face *)&pp);
          setsorg(this,(face *)&pp,pdVar3);
          setsdest(this,(face *)&pp,endpt);
          setsapex(this,(face *)&pp,(point)0x0);
          setshellmark(this,(face *)&pp,-1);
          ssbond(this,searchsh,(face *)&pp);
          spivot(this,searchsh,(face *)&startpt);
          if (startpt != (point)0x0) {
            ssbond(this,(face *)&startpt,(face *)&pp);
          }
        }
        this_local._4_4_ = ori_ab._4_4_;
      }
      else if (ori_ab._4_4_ == ACROSSVERT) {
        if (reporterrorflag != 0) {
          pdVar4 = sdest(this,searchsh);
          uVar1 = shellmark(this,searchsh);
          printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",(ulong)uVar1);
          uVar1 = pointmark(this,pdVar4);
          printf("  Vertex:  [%d] (%g,%g,%g).\n",*pdVar4,pdVar4[1],pdVar4[2],(ulong)uVar1);
          uVar1 = pointmark(this,pdVar3);
          uVar2 = pointmark(this,endpt);
          printf("  Segment: [%d, %d]\n",(ulong)uVar1,(ulong)uVar2);
        }
        this_local._4_4_ = ori_ab._4_4_;
      }
      else {
        if (ori_ab._4_4_ == ACROSSEDGE) {
          senext(this,searchsh,(face *)&neighsh.shver);
          if (*(long *)(neighsh._8_8_ + (long)(((int)flipshs[0].sh >> 1) + 6) * 8) != 0) {
            if (reporterrorflag != 0) {
              tq = 0.0;
              local_118 = 0.0;
              linelineint(this,pdVar3,endpt,pdVar4,pd,&local_e8,&tp,&tq,&local_118);
              printf("PLC Error:  Two segments intersect at point (%g,%g,%g),",local_e8,P[0],P[1]);
              uVar1 = shellmark(this,searchsh);
              printf(" in facet #%d.\n",(ulong)uVar1);
              uVar1 = pointmark(this,pdVar4);
              uVar2 = pointmark(this,pd);
              printf("  Segment 1: [%d, %d]\n",(ulong)uVar1,(ulong)uVar2);
              uVar1 = pointmark(this,pdVar3);
              uVar2 = pointmark(this,endpt);
              printf("  Segment 2: [%d, %d]\n",(ulong)uVar1,(ulong)uVar2);
            }
            return ACROSSEDGE;
          }
          spivot(this,(face *)&neighsh.shver,(face *)&flipshs[0].shver);
          pdVar3 = sorg(this,(face *)&flipshs[0].shver);
          pdVar4 = sdest(this,(face *)&neighsh.shver);
          if (pdVar3 != pdVar4) {
            sesymself(this,(face *)&flipshs[0].shver);
          }
          flip22(this,(face *)&neighsh.shver,1,0);
          pdVar3 = sapex(this,(face *)&flipshs[0].shver);
          pdVar4 = sapex(this,(face *)&neighsh.shver);
          pdVar6 = sorg(this,(face *)&neighsh.shver);
          pb_00 = sdest(this,(face *)&neighsh.shver);
          dVar8 = orient3d(pdVar6,pb_00,this->dummypoint,pdVar4);
          dVar9 = orient3d(pb_00,pdVar6,this->dummypoint,pdVar3);
          if (0.0 < dVar8) {
            if (dVar9 <= 0.0) {
              flipshpush(this,(face *)&flipshs[0].shver);
            }
          }
          else {
            flipshpush(this,(face *)&neighsh.shver);
          }
          face::operator=(searchsh,(face *)&neighsh.shver);
        }
        this_local._4_4_ =
             sscoutsegment(this,searchsh,endpt,insertsegflag,reporterrorflag,flipshs[1]._12_4_);
      }
      return this_local._4_4_;
    }
    pd = sapex(this,searchsh);
    if (pd == endpt) {
      senext2self(this,searchsh);
      sesymself(this,searchsh);
      ori_ab._4_4_ = SHAREEDGE;
      goto LAB_00143f64;
    }
    dVar8 = triarea(this,pdVar3,pdVar4,endpt);
    dVar8 = sqrt(dVar8);
    if (this->b->epsilon <= dVar8 / (double)newseg._8_8_) {
      ori_ca = orient3d(pdVar3,pdVar4,this->dummypoint,endpt);
    }
    else {
      ori_ca = 0.0;
    }
    dVar8 = triarea(this,pd,pdVar3,endpt);
    dVar8 = sqrt(dVar8);
    if (this->b->epsilon <= dVar8 / (double)newseg._8_8_) {
      len = orient3d(pd,pdVar3,this->dummypoint,endpt);
    }
    else {
      len = 0.0;
    }
    if (0.0 <= ori_ca) {
      if (0.0 <= len) {
        if (0.0 < ori_ca) {
          if (len <= 0.0) {
            senext2self(this,searchsh);
            sesymself(this,searchsh);
            ori_ab._4_4_ = ACROSSVERT;
          }
          else {
            ori_ab._4_4_ = ACROSSEDGE;
          }
          goto LAB_00143f64;
        }
        if (0.0 < len) {
          ori_ab._4_4_ = ACROSSVERT;
          goto LAB_00143f64;
        }
        terminatetetgen(this,2);
      }
      else {
        bVar7 = true;
      }
    }
    else if (0.0 <= len) {
      bVar7 = false;
    }
    else {
      uVar5 = randomnation(this,2);
      bVar7 = uVar5 != 0;
    }
    if (bVar7) {
      senext2(this,searchsh,(face *)&startpt);
      if ((flipshs[1]._12_4_ != 0) && (startpt[((int)neighsh.sh >> 1) + 6] != 0.0)) {
        face::operator=(searchsh,(face *)&startpt);
        return ACROSSEDGE;
      }
      spivotself(this,(face *)&startpt);
      if (startpt == (point)0x0) {
        if ((flipshs[1]._12_4_ != 0) && (searchsh->sh[(searchsh->shver >> 1) + 6] != (shellface)0x0)
           ) {
          return ACROSSEDGE;
        }
        spivot(this,searchsh,(face *)&startpt);
        pdVar6 = sorg(this,(face *)&startpt);
        if (pdVar6 != pdVar4) {
          sesymself(this,(face *)&startpt);
        }
        senext(this,(face *)&startpt,searchsh);
      }
      else {
        pdVar4 = sdest(this,(face *)&startpt);
        if (pdVar4 != pd) {
          sesymself(this,(face *)&startpt);
        }
        face::operator=(searchsh,(face *)&startpt);
      }
    }
    else {
      if ((flipshs[1]._12_4_ != 0) && (searchsh->sh[(searchsh->shver >> 1) + 6] != (shellface)0x0))
      {
        return ACROSSEDGE;
      }
      spivot(this,searchsh,(face *)&startpt);
      if (startpt == (point)0x0) {
        senext2(this,searchsh,(face *)&startpt);
        if ((flipshs[1]._12_4_ != 0) && (startpt[((int)neighsh.sh >> 1) + 6] != 0.0)) {
          face::operator=(searchsh,(face *)&startpt);
          return ACROSSEDGE;
        }
        spivotself(this,(face *)&startpt);
        pdVar4 = sdest(this,(face *)&startpt);
        if (pdVar4 != pd) {
          sesymself(this,(face *)&startpt);
        }
        face::operator=(searchsh,(face *)&startpt);
      }
      else {
        pdVar6 = sorg(this,(face *)&startpt);
        if (pdVar6 != pdVar4) {
          sesymself(this,(face *)&startpt);
        }
        senext(this,(face *)&startpt,searchsh);
      }
    }
  } while( true );
}

Assistant:

enum tetgenmesh::interresult tetgenmesh::sscoutsegment(face *searchsh, 
  point endpt, int insertsegflag, int reporterrorflag, int chkencflag)
{
  face flipshs[2], neighsh;
  point startpt, pa, pb, pc, pd;
  enum interresult dir;
  enum {MOVE_AB, MOVE_CA} nextmove;
  REAL ori_ab, ori_ca, len;

  // The origin of 'searchsh' is fixed.
  startpt = sorg(*searchsh); 
  nextmove = MOVE_AB; // Avoid compiler warning.

  if (b->verbose > 2) {
    printf("      Scout segment (%d, %d).\n", pointmark(startpt),
           pointmark(endpt));
  }
  len = distance(startpt, endpt);

  // Search an edge in 'searchsh' on the path of this segment.
  while (1) {

    pb = sdest(*searchsh);
    if (pb == endpt) {
      dir = SHAREEDGE; // Found!
      break;
    }

    pc = sapex(*searchsh);
    if (pc == endpt) {
      senext2self(*searchsh);
      sesymself(*searchsh);
      dir = SHAREEDGE; // Found!
      break;
    }


    // Round the results.
    if ((sqrt(triarea(startpt, pb, endpt)) / len) < b->epsilon) {
      ori_ab = 0.0;
    } else {
      ori_ab = orient3d(startpt, pb, dummypoint, endpt);
    }
    if ((sqrt(triarea(pc, startpt, endpt)) / len) < b->epsilon) {
      ori_ca = 0.0;
    } else {
      ori_ca = orient3d(pc, startpt, dummypoint, endpt);
    }

    if (ori_ab < 0) {
      if (ori_ca < 0) { // (--)
        // Both sides are viable moves.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_AB;
        }
      } else { // (-#)
        nextmove = MOVE_AB;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        nextmove = MOVE_CA;
      } else {
        if (ori_ab > 0) {
          if (ori_ca > 0) { // (++)
            // The segment intersects with edge [b, c].
            dir = ACROSSEDGE;
            break;
          } else { // (+0)
            // The segment collinear with edge [c, a].
            senext2self(*searchsh);
            sesymself(*searchsh); 
            dir = ACROSSVERT;
            break;
          }
        } else {
          if (ori_ca > 0) { // (0+)
            // The segment is collinear with edge [a, b].
            dir = ACROSSVERT;
            break;
          } else { // (00)
            // startpt == endpt. Not possible.
            terminatetetgen(this, 2);
          }
        }
      }
    }

    // Move 'searchsh' to the next face, keep the origin unchanged.
    if (nextmove == MOVE_AB) {
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(*searchsh)) {
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      } else {
        // This side (startpt->pb) is outside. It is caused by rounding error.
        // Try the next side, i.e., (pc->startpt).
        senext2(*searchsh, neighsh);
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(neighsh)) {
            *searchsh = neighsh;
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivotself(neighsh);
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      }
    } else { // MOVE_CA
      senext2(*searchsh, neighsh);
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(neighsh)) {
          *searchsh = neighsh;
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivotself(neighsh);
      if (neighsh.sh != NULL) {
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      } else {
        // The same reason as above. 
        // Try the next side, i.e., (startpt->pb).
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(*searchsh)) {
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivot(*searchsh, neighsh);
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      }
    }
  } // while

  if (dir == SHAREEDGE) {
    if (insertsegflag) {
      // Insert the segment into the triangulation.
      face newseg;
      makeshellface(subsegs, &newseg);
      setshvertices(newseg, startpt, endpt, NULL);
      // Set the default segment marker.
      setshellmark(newseg, -1);
      ssbond(*searchsh, newseg);
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        ssbond(neighsh, newseg);
      }
    }
    return dir;
  }

  if (dir == ACROSSVERT) {
    // A point is found collinear with this segment.
    if (reporterrorflag) {
      point pp = sdest(*searchsh);
      printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
             shellmark(*searchsh));
      printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
      printf("  Segment: [%d, %d]\n", pointmark(startpt), pointmark(endpt));
    }
    return dir;
  }

  if (dir == ACROSSEDGE) {
    // Edge [b, c] intersects with the segment.
    senext(*searchsh, flipshs[0]);
    if (isshsubseg(flipshs[0])) {
      if (reporterrorflag) {
        REAL P[3], Q[3], tp = 0, tq = 0;
        linelineint(startpt, endpt, pb, pc, P, Q, &tp, &tq);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),", 
               P[0], P[1], P[2]);
        printf(" in facet #%d.\n", shellmark(*searchsh));
        printf("  Segment 1: [%d, %d]\n", pointmark(pb), pointmark(pc));
        printf("  Segment 2: [%d, %d]\n", pointmark(startpt),pointmark(endpt));
      }
      return dir; // ACROSS_SEG
    }
    // Flip edge [b, c], queue unflipped edges (for Delaunay checks).
    spivot(flipshs[0], flipshs[1]);
    if (sorg(flipshs[1]) != sdest(flipshs[0])) sesymself(flipshs[1]);
    flip22(flipshs, 1, 0);
    // The flip may create an inverted triangle, check it.
    pa = sapex(flipshs[1]);
    pb = sapex(flipshs[0]);
    pc = sorg(flipshs[0]);
    pd = sdest(flipshs[0]);
    // Check if pa and pb are on the different sides of [pc, pd]. 
    // Re-use ori_ab, ori_ca for the tests.
    ori_ab = orient3d(pc, pd, dummypoint, pb);
    ori_ca = orient3d(pd, pc, dummypoint, pa);
    if (ori_ab <= 0) {
      flipshpush(&(flipshs[0])); 
    } else if (ori_ca <= 0) {
      flipshpush(&(flipshs[1])); 
    }
    // Set 'searchsh' s.t. its origin is 'startpt'.
    *searchsh = flipshs[0];
  }

  return sscoutsegment(searchsh, endpt, insertsegflag, reporterrorflag, 
                       chkencflag);
}